

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void DecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  size_t *psVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  long *plVar8;
  uint *puVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  HuffmanCode *pHVar13;
  ulong uVar14;
  HuffmanCode *pHVar15;
  
  uVar5 = s->num_block_types[0];
  if (1 < uVar5) {
    pHVar13 = s->block_type_trees;
    uVar11 = (s->br).bit_pos_;
    if (0x2f < uVar11) {
      uVar7 = (s->br).val_;
      plVar8 = (long *)(s->br).next_in;
      (s->br).val_ = uVar7 >> 0x30;
      (s->br).bit_pos_ = uVar11 ^ 0x30;
      (s->br).val_ = *plVar8 << 0x10 | uVar7 >> 0x30;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      (s->br).next_in = (uint8_t *)((long)plVar8 + 6);
    }
    uVar7 = (s->br).val_;
    uVar6 = (s->br).bit_pos_;
    uVar14 = uVar7 >> ((byte)uVar6 & 0x3f);
    pHVar13 = pHVar13 + (uVar14 & 0xff);
    bVar2 = pHVar13->bits;
    if (8 < bVar2) {
      (s->br).bit_pos_ = uVar6 + 8;
      pHVar13 = pHVar13 + (((uint)(uVar14 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                          (uint)pHVar13->value);
    }
    uVar11 = (uint)pHVar13->bits + (s->br).bit_pos_;
    pHVar15 = s->block_len_trees;
    (s->br).bit_pos_ = uVar11;
    uVar3 = pHVar13->value;
    if (0x2f < uVar11) {
      (s->br).val_ = uVar7 >> 0x30;
      (s->br).bit_pos_ = uVar11 ^ 0x30;
      plVar8 = (long *)(s->br).next_in;
      (s->br).val_ = *plVar8 << 0x10 | uVar7 >> 0x30;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      (s->br).next_in = (uint8_t *)((long)plVar8 + 6);
    }
    uVar7 = (s->br).val_;
    uVar6 = (s->br).bit_pos_;
    uVar14 = uVar7 >> ((byte)uVar6 & 0x3f);
    pHVar15 = pHVar15 + (uVar14 & 0xff);
    bVar2 = pHVar15->bits;
    if (8 < bVar2) {
      (s->br).bit_pos_ = uVar6 + 8;
      pHVar15 = pHVar15 + (((uint)(uVar14 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                          (uint)pHVar15->value);
    }
    uVar11 = (uint)pHVar15->bits + (s->br).bit_pos_;
    (s->br).bit_pos_ = uVar11;
    bVar2 = kBlockLengthPrefixCode[pHVar15->value].nbits;
    uVar4 = kBlockLengthPrefixCode[pHVar15->value].offset;
    if (0x1f < uVar11) {
      (s->br).val_ = uVar7 >> 0x20;
      (s->br).bit_pos_ = uVar11 ^ 0x20;
      puVar9 = (uint *)(s->br).next_in;
      (s->br).val_ = (ulong)*puVar9 << 0x20 | uVar7 >> 0x20;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 4;
      (s->br).next_in = (uint8_t *)(puVar9 + 1);
    }
    uVar6 = (s->br).bit_pos_;
    uVar11 = kBitMask[(uint)bVar2];
    (s->br).bit_pos_ = uVar6 + bVar2;
    s->block_length[0] = ((uint)((s->br).val_ >> ((byte)uVar6 & 0x3f)) & uVar11) + (uint)uVar4;
    if (uVar3 == 0) {
      uVar11 = s->block_type_rb[0];
    }
    else if (uVar3 == 1) {
      uVar11 = s->block_type_rb[1] + 1;
    }
    else {
      uVar11 = uVar3 - 2;
    }
    uVar12 = 0;
    if (uVar5 <= uVar11) {
      uVar12 = uVar5;
    }
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = uVar11 - uVar12;
    if (1 < uVar5) {
      if ((s->field_0x338 & 0x40) != 0) {
        if (s->saved_position_literals_begin != 0) {
          sVar10 = (s->literals_block_splits).num_blocks;
          (s->literals_block_splits).positions_end[sVar10] = position;
          (s->literals_block_splits).num_blocks = sVar10 + 1;
        }
        sVar10 = (s->literals_block_splits).num_blocks;
        (s->literals_block_splits).positions_begin[sVar10] = position;
        (s->literals_block_splits).types[sVar10] =
             (char)(int)(s->literals_block_splits).num_types_prev_metablocks +
             (char)s->block_type_rb[1];
        uVar7 = (s->literals_block_splits).num_types;
        uVar14 = (ulong)(s->literals_block_splits).types[(s->literals_block_splits).num_blocks] + 1;
        if (uVar14 < uVar7) {
          uVar14 = uVar7;
        }
        (s->literals_block_splits).num_types = uVar14;
      }
      uVar5 = s->block_type_rb[1];
      s->context_map_slice = s->context_map + (uVar5 << 6);
      s->trivial_literal_context =
           (uint)((s->trivial_literal_contexts[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0);
      s->literal_htree = (s->literal_hgroup).htrees[s->context_map[uVar5 << 6]];
      s->context_lookup = "" + ((s->context_modes[uVar5] & 3) << 9);
    }
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}